

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_readclosure(HSQUIRRELVM v,SQREADFUNC r,SQUserPointer up)

{
  bool bVar1;
  SQInteger SVar2;
  SQRESULT SVar3;
  char *err;
  unsigned_short tag;
  SQObjectPtr closure;
  
  closure.super_SQObject._type = OT_NULL;
  closure.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar2 = (*r)(up,&tag,2);
  if (SVar2 == 2) {
    if (tag != 0xfafa) {
      err = "invalid stream";
      goto LAB_0010cf07;
    }
    bVar1 = SQClosure::Load(v,up,r,&closure);
    if (bVar1) {
      SQVM::Push(v,&closure);
      SVar3 = 0;
      goto LAB_0010cf12;
    }
  }
  else {
    err = "io error";
LAB_0010cf07:
    sq_throwerror(v,err);
  }
  SVar3 = -1;
LAB_0010cf12:
  SQObjectPtr::~SQObjectPtr(&closure);
  return SVar3;
}

Assistant:

SQRESULT sq_readclosure(HSQUIRRELVM v,SQREADFUNC r,SQUserPointer up)
{
    SQObjectPtr closure;

    unsigned short tag;
    if(r(up,&tag,2) != 2)
        return sq_throwerror(v,_SC("io error"));
    if(tag != SQ_BYTECODE_STREAM_TAG)
        return sq_throwerror(v,_SC("invalid stream"));
    if(!SQClosure::Load(v,up,r,closure))
        return SQ_ERROR;
    v->Push(closure);
    return SQ_OK;
}